

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mf_common.cpp
# Opt level: O3

double SqrSum(vector<double,_std::allocator<double>_> *arr)

{
  double dVar1;
  pointer pdVar2;
  long lVar3;
  long lVar4;
  double dVar5;
  
  pdVar2 = (arr->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  lVar3 = (long)(arr->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_finish - (long)pdVar2;
  if (lVar3 != 0) {
    lVar3 = lVar3 >> 3;
    dVar5 = 0.0;
    lVar4 = 0;
    do {
      dVar1 = pdVar2[lVar4];
      dVar5 = dVar5 + dVar1 * dVar1;
      lVar4 = lVar4 + 1;
    } while (lVar3 + (ulong)(lVar3 == 0) != lVar4);
    return dVar5;
  }
  return 0.0;
}

Assistant:

double SqrSum(const vector<double> &arr) {
    double s = 0;
    for (int i = 0; i < arr.size(); i++)
            s+=sqr(arr[i]);
    return s;
}